

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraction.cpp
# Opt level: O0

Fraction operator+(int *a,Fraction *b)

{
  Fraction *b_local;
  int *a_local;
  Fraction current_frac;
  
  a_local._0_4_ = (*b).numerator_;
  a_local = (int *)CONCAT44((*b).denominator_,b->denominator_ * *a + (int)a_local);
  Fraction::Normalization((Fraction *)&a_local);
  return (Fraction)a_local;
}

Assistant:

Fraction operator+(const int& a, const Fraction& b) {
  Fraction current_frac = b;
  current_frac.numerator_ += b.denominator_ * a;
  current_frac.Normalization();
  return current_frac;
}